

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O3

bool cmForEachCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  cmList *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type __val;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  _Alloc_hider _Var7;
  string *psVar8;
  tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_> tVar9;
  pointer pbVar10;
  int iVar11;
  size_type sVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  char cVar18;
  pointer pbVar19;
  _Alloc_hider _Var20;
  undefined8 in_R9;
  string *__x;
  int iVar21;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  anon_class_16_2_5155b745 __gen;
  size_type __dnew;
  int cc;
  int stop;
  string __str;
  string local_100;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_b8;
  size_type local_b0;
  pointer local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  long *local_90;
  long **local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  uint local_78;
  undefined4 uStack_74;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  long *local_60;
  uint local_58;
  undefined4 uStack_54;
  long local_50 [2];
  __uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_40;
  size_type local_38;
  
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar19 == pbVar10) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
      return false;
    }
    operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1));
    return false;
  }
  _Var6 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[3]>>
                    (pbVar19,pbVar10,"IN");
  this_01 = status->Makefile;
  if (_Var6._M_current !=
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    _Var7._M_p = (pointer)operator_new(200);
    *(size_type **)((long)_Var7._M_p + 8) = (size_type *)((long)_Var7._M_p + 0x18);
    *(size_type *)((long)_Var7._M_p + 0x10) = 0;
    *(char *)((long)_Var7._M_p + 0x18) = '\0';
    *(size_type **)((long)_Var7._M_p + 0x28) = (size_type *)((long)_Var7._M_p + 0x38);
    *(size_type *)((long)_Var7._M_p + 0x30) = 0;
    *(char *)((long)_Var7._M_p + 0x38) = '\0';
    *(size_type *)((long)_Var7._M_p + 0x48) = 0;
    *(char *)((long)_Var7._M_p + 0x70) = '\0';
    *(size_type *)((long)_Var7._M_p + 0x78) = 0;
    *(size_type *)((long)_Var7._M_p + 0x80) = 0;
    *(size_type *)((long)_Var7._M_p + 0x88) = 0;
    *(undefined4 *)((long)_Var7._M_p + 0x90) = 1;
    *(undefined ***)_Var7._M_p = &PTR__cmForEachFunctionBlocker_00a3ab40;
    this = (cmList *)((long)_Var7._M_p + 0x98);
    *(size_type *)((long)_Var7._M_p + 0x98) = 0;
    *(size_type *)((long)_Var7._M_p + 0xa0) = 0;
    *(size_type *)((long)_Var7._M_p + 0xa8) = 0;
    *(cmMakefile **)((long)_Var7._M_p + 0xb0) = this_01;
    *(size_type *)((long)_Var7._M_p + 0xb8) = 0;
    *(char *)((long)_Var7._M_p + 0xc0) = '\0';
    cmMakefile::PushLoopBlock(this_01);
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar16 = (long)_Var6._M_current - (long)pbVar19 >> 5;
    if (0 < lVar16) {
      uVar17 = lVar16 + 1;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,pbVar19);
        pbVar19 = pbVar19 + 1;
        uVar17 = uVar17 - 1;
      } while (1 < uVar17);
    }
    lVar16 = *(size_type *)((long)_Var7._M_p + 0xa0) - *(size_type *)((long)_Var7._M_p + 0x98);
    *(long *)((long)_Var7._M_p + 0xb8) = lVar16 >> 5;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    __x = _Var6._M_current + 1;
    if (__x != pbVar1) {
      uVar15 = 0;
      local_38 = lVar16 >> 5;
      do {
        iVar4 = std::__cxx11::string::compare((char *)__x);
        if (iVar4 == 0) {
          if (uVar15 == 3) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            local_100._M_dataplus._M_p = (pointer)0x2d;
            local_e0._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_100);
            local_e0.field_2._M_allocated_capacity = (size_type)local_100._M_dataplus._M_p;
            builtin_strncpy((char *)((long)local_e0._M_dataplus._M_p + 0x1d),"h LISTS ",8);
            builtin_strncpy((char *)((long)local_e0._M_dataplus._M_p + 0x25),"or ITEMS",8);
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x10) = 0x6573752065622074;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x18) = 0x4c20687469772064;
            *(undefined8 *)local_e0._M_dataplus._M_p = 0x5453494c5f50495a;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 8) = 0x6f6e206e61632053;
            local_e0._M_string_length = (size_type)local_100._M_dataplus._M_p;
            local_e0._M_dataplus._M_p[(long)local_100._M_dataplus._M_p] = '\0';
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e0);
          }
          else {
            uVar15 = 1;
            if (lVar16 == 0x20) goto LAB_002e01b6;
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            local_100._M_dataplus._M_p = (pointer)0x35;
            local_e0._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_e0,(ulong)&local_100);
            local_e0.field_2._M_allocated_capacity = (size_type)local_100._M_dataplus._M_p;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x20) = 0x617265746920656e;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x28) = 0x726176206e6f6974;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x10) = 0x6520657269757165;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 0x18) = 0x6f20796c74636178;
            *(undefined8 *)local_e0._M_dataplus._M_p = 0x726f20534d455449;
            *(undefined8 *)((long)local_e0._M_dataplus._M_p + 8) = 0x7220535453494c20;
            builtin_strncpy((char *)((long)local_e0._M_dataplus._M_p + 0x2d),"variable",8);
            local_e0._M_string_length = (size_type)local_100._M_dataplus._M_p;
            local_e0._M_dataplus._M_p[(long)local_100._M_dataplus._M_p] = '\0';
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e0);
          }
LAB_002e068b:
          local_100.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
          _Var20._M_p = local_e0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_002e069a;
          goto LAB_002e06a7;
        }
        iVar4 = std::__cxx11::string::compare((char *)__x);
        if (iVar4 == 0) {
          if (uVar15 == 3) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"ZIP_LISTS can not be used with LISTS or ITEMS","");
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e0);
          }
          else {
            uVar15 = 2;
            if (lVar16 == 0x20) goto LAB_002e01b6;
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"ITEMS or LISTS require exactly one iteration variable",
                       "");
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e0);
          }
          goto LAB_002e068b;
        }
        iVar4 = std::__cxx11::string::compare((char *)__x);
        if (iVar4 == 0) {
          if (uVar15 != 0) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"ZIP_LISTS can not be used with LISTS or ITEMS","");
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_e0);
            goto LAB_002e068b;
          }
          *(char *)((long)_Var7._M_p + 0xc0) = '\x01';
          uVar15 = 3;
        }
        else if (uVar15 == 1) {
          psVar8 = cmMakefile::GetSafeDefinition(this_01,__x);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              psVar8->_M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            uVar15 = 1;
          }
          else {
            uVar15 = 1;
            value._M_str = (char *)0x1;
            value._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
            cmList::insert(this,*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  **)((long)_Var7._M_p + 0xa0),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           psVar8->_M_string_length,value,(EmptyElements)in_R9);
          }
        }
        else {
          if ((uVar15 & 0xfffffffe) != 2) {
            local_e0._M_dataplus._M_p = (pointer)0x12;
            local_e0._M_string_length = 0x7ef6ba;
            local_e0.field_2._M_allocated_capacity = 0;
            local_e0.field_2._8_8_ = 2;
            local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x7ec13b;
            local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)0x0;
            local_a8 = (__x->_M_dataplus)._M_p;
            local_b0 = __x->_M_string_length;
            local_a0 = 0;
            local_98 = 1;
            local_90 = (long *)0x80edee;
            local_88 = (long **)0x0;
            views._M_len = 4;
            views._M_array = (iterator)&local_e0;
            cmCatViews(&local_100,views);
            cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_100);
            _Var20._M_p = local_100._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_100._M_dataplus._M_p != &local_100.field_2) goto LAB_002e069a;
            goto LAB_002e06a7;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this,__x);
        }
LAB_002e01b6:
        __val = local_38;
        __x = __x + 1;
      } while (__x != pbVar1);
      if ((1 < local_38 && uVar15 == 3) &&
         (lVar16 >> 4 !=
          (long)(*(size_type *)((long)_Var7._M_p + 0xa0) - *(size_type *)((long)_Var7._M_p + 0x98))
          >> 5)) {
        cVar18 = '\x01';
        if (9 < local_38) {
          sVar12 = local_38;
          cVar2 = '\x04';
          do {
            cVar18 = cVar2;
            if (sVar12 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_002e08a9;
            }
            if (sVar12 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_002e08a9;
            }
            if (sVar12 < 10000) goto LAB_002e08a9;
            bVar3 = 99999 < sVar12;
            sVar12 = sVar12 / 10000;
            cVar2 = cVar18 + '\x04';
          } while (bVar3);
          cVar18 = cVar18 + '\x01';
        }
LAB_002e08a9:
        local_80 = &local_70;
        std::__cxx11::string::_M_construct((ulong)&local_80,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_80->_M_local_buf,local_78,__val);
        uVar17 = ((long)(*(size_type *)((long)_Var7._M_p + 0xa0) -
                        *(size_type *)((long)_Var7._M_p + 0x98)) >> 5) - __val;
        cVar18 = '\x01';
        if (9 < uVar17) {
          uVar13 = uVar17;
          cVar2 = '\x04';
          do {
            cVar18 = cVar2;
            if (uVar13 < 100) {
              cVar18 = cVar18 + -2;
              goto LAB_002e0954;
            }
            if (uVar13 < 1000) {
              cVar18 = cVar18 + -1;
              goto LAB_002e0954;
            }
            if (uVar13 < 10000) goto LAB_002e0954;
            bVar3 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            cVar2 = cVar18 + '\x04';
          } while (bVar3);
          cVar18 = cVar18 + '\x01';
        }
LAB_002e0954:
        local_60 = local_50;
        std::__cxx11::string::_M_construct((ulong)&local_60,cVar18);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_60,local_58,uVar17);
        local_e0._M_dataplus._M_p = &DAT_00000009;
        local_e0._M_string_length = 0x7ef6cd;
        local_e0.field_2._M_allocated_capacity = 0;
        local_e0.field_2._8_8_ = CONCAT44(uStack_74,local_78);
        local_c0 = local_80;
        local_b0 = 0x1b;
        local_a8 = " list variables, but given ";
        local_a0 = 0;
        local_98 = CONCAT44(uStack_54,local_58);
        local_90 = local_60;
        views_00._M_len = 4;
        views_00._M_array = (iterator)&local_e0;
        local_b8 = &local_80;
        local_88 = &local_60;
        cmCatViews(&local_100,views_00);
        cmMakefile::IssueMessage(this_01,FATAL_ERROR,&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,
                          (ulong)(local_100.field_2._M_allocated_capacity + 1));
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        local_100.field_2._M_allocated_capacity = local_70._M_allocated_capacity;
        _Var20._M_p = (pointer)local_80;
        if (local_80 != &local_70) {
LAB_002e069a:
          operator_delete(_Var20._M_p,(ulong)(local_100.field_2._M_allocated_capacity + 1));
        }
        goto LAB_002e06a7;
      }
    }
    local_e0._M_dataplus._M_p = _Var7._M_p;
    cmMakefile::AddFunctionBlocker
              (this_01,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                       &local_e0);
    _Var7._M_p = local_e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return true;
    }
LAB_002e06a7:
    (**(code **)(*(size_type *)_Var7._M_p + 8))();
    return true;
  }
  tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
  super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
       operator_new(200);
  *(long **)((long)tVar9.
                   super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                   .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar9.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18);
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined1 *)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x18) = 0;
  *(long **)((long)tVar9.
                   super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                   .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x28) =
       (long *)((long)tVar9.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38);
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined1 *)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined1 *)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x70) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x78) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x80) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined4 *)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x90) = 1;
  *(undefined ***)
   tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
   super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
       &PTR__cmForEachFunctionBlocker_00a3ab40;
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)tVar9.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98);
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0x98) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0) = 0;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa8) = 0;
  *(cmMakefile **)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb0) = this_01;
  *(long *)((long)tVar9.
                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined1 *)
   ((long)tVar9.super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
          .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xc0) = 0;
  cmMakefile::PushLoopBlock(this_01);
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar19) < 0x21) ||
     (iVar4 = std::__cxx11::string::compare((char *)(pbVar19 + 1)), iVar4 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this_00,args);
    goto LAB_002e0332;
  }
  local_100._M_dataplus._M_p = local_100._M_dataplus._M_p & 0xffffffff00000000;
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)local_80 & 0xffffffff00000000);
  local_60 = (long *)((ulong)local_60 & 0xffffffff00000000);
  pbVar19 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar10 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pbVar10 - (long)pbVar19 == 0x60) {
    bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger(status,pbVar19 + 2,(int *)&local_80);
    if (!bVar3) goto LAB_002e0829;
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pbVar10 - (long)pbVar19 == 0x80) {
    bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger(status,pbVar19 + 2,(int *)&local_100);
    if ((!bVar3) ||
       (bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger
                          (status,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 3,(int *)&local_80),
       !bVar3)) goto LAB_002e0829;
    pbVar19 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar10 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((long)pbVar10 - (long)pbVar19 == 0xa0) {
    bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger(status,pbVar19 + 2,(int *)&local_100);
    if (((!bVar3) ||
        (bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger
                           (status,(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 3,(int *)&local_80),
        !bVar3)) ||
       (bVar3 = anon_unknown.dwarf_b64b79::TryParseInteger
                          (status,(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + 4,(int *)&local_60),
       !bVar3)) goto LAB_002e0829;
    iVar4 = (int)local_60;
    iVar21 = (int)local_100._M_dataplus._M_p;
    iVar14 = (int)local_80;
    if ((int)local_60 == 0) goto LAB_002e076d;
LAB_002e0797:
    bVar3 = iVar14 < iVar21;
    if (!bVar3 || iVar4 < 1) goto LAB_002e07a8;
  }
  else {
    iVar21 = (int)local_100._M_dataplus._M_p;
    iVar14 = (int)local_80;
LAB_002e076d:
    if (iVar21 <= iVar14) {
      local_60 = (long *)CONCAT44(local_60._4_4_,1);
      iVar4 = 1;
      goto LAB_002e0797;
    }
    local_60 = (long *)CONCAT44(local_60._4_4_,0xffffffff);
    iVar4 = -1;
    bVar3 = true;
LAB_002e07a8:
    if (-1 < iVar4 || iVar14 <= iVar21) {
      iVar11 = iVar21 - iVar14;
      iVar5 = -(iVar21 - iVar14);
      if (iVar14 <= iVar21) {
        iVar5 = 0;
      }
      iVar14 = -iVar4;
      if (0 < iVar4) {
        iVar14 = iVar4;
      }
      if (!bVar3) {
        iVar11 = 0;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(this_00,(ulong)(iVar5 / iVar14 + iVar11 / iVar14 + 2));
      std::__cxx11::string::_M_assign
                ((string *)
                 (this_00->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      local_e0._M_dataplus._M_p._0_4_ = iVar21;
      __gen.step = iVar4;
      __gen.cc = (int *)&local_e0;
      __gen._12_4_ = 0;
      std::
      generate<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmForEachCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (*(long *)((long)tVar9.
                                  super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                                  .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl +
                           0x98) + 0x20),
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)tVar9.
                         super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                         .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xa0),
                 __gen);
LAB_002e0332:
      *(long *)((long)tVar9.
                      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                      .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 0xb8) = 1;
      local_40._M_t.
      super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
      super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl =
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           (tuple<cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
           tVar9.
           super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
           super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl;
      cmMakefile::AddFunctionBlocker
                (status->Makefile,
                 (unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)&local_40
                );
      if ((_Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
          super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl != (cmFunctionBlocker *)0x0
         ) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                              .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
                  ();
        return true;
      }
      return true;
    }
  }
  cmStrCat<char_const(&)[50],int&,char_const(&)[8],int&,char_const(&)[8],int&>
            (&local_e0,(char (*) [50])"called with incorrect range specification: start ",
             (int *)&local_100,(char (*) [8])", stop ",(int *)&local_80,(char (*) [8])", step ",
             (int *)&local_60);
  std::__cxx11::string::_M_assign((string *)&status->Error);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1));
  }
  cmSystemTools::s_FatalErrorOccurred = true;
LAB_002e0829:
  (**(code **)(*(long *)tVar9.
                        super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                        .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl + 8))
            (tVar9.
             super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>.
             super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl);
  return false;
}

Assistant:

bool cmForEachCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }
  auto kwInIter = std::find(args.begin(), args.end(), "IN");
  if (kwInIter != args.end()) {
    return HandleInMode(args, kwInIter, status.GetMakefile());
  }

  // create a function blocker
  auto fb = cm::make_unique<cmForEachFunctionBlocker>(&status.GetMakefile());
  if (args.size() > 1) {
    if (args[1] == "RANGE") {
      int start = 0;
      int stop = 0;
      int step = 0;
      if (args.size() == 3) {
        if (!TryParseInteger(status, args[2], stop)) {
          return false;
        }
      }
      if (args.size() == 4) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
      }
      if (args.size() == 5) {
        if (!TryParseInteger(status, args[2], start)) {
          return false;
        }
        if (!TryParseInteger(status, args[3], stop)) {
          return false;
        }
        if (!TryParseInteger(status, args[4], step)) {
          return false;
        }
      }
      if (step == 0) {
        if (start > stop) {
          step = -1;
        } else {
          step = 1;
        }
      }
      if ((start > stop && step > 0) || (start < stop && step < 0) ||
          step == 0) {
        status.SetError(
          cmStrCat("called with incorrect range specification: start ", start,
                   ", stop ", stop, ", step ", step));
        cmSystemTools::SetFatalErrorOccurred();
        return false;
      }

      // Calculate expected iterations count and reserve enough space
      // in the `fb->Args` vector. The first item is the iteration variable
      // name...
      const std::size_t iter_cnt = 2u +
        static_cast<int>(start < stop) * (stop - start) / std::abs(step) +
        static_cast<int>(start > stop) * (start - stop) / std::abs(step);
      fb->Args.resize(iter_cnt);
      fb->Args.front() = args.front();
      auto cc = start;
      auto generator = [&cc, step]() -> std::string {
        auto result = std::to_string(cc);
        cc += step;
        return result;
      };
      // Fill the `range` vector w/ generated string values
      // (starting from 2nd position)
      std::generate(++fb->Args.begin(), fb->Args.end(), generator);
    } else {
      fb->Args = args;
    }
  } else {
    fb->Args = args;
  }

  fb->SetIterationVarsCount(1u);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}